

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O2

int Int2_ManChainStart(Int2_Man_t *p,clause *c)

{
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar1;
  clause cVar2;
  int iVar3;
  int iVar4;
  clause iLit0;
  Gia_Obj_t *pObj;
  ulong uVar5;
  
  cVar2 = *c;
  if (((uint)cVar2 & 1) == 0) {
    if (((uint)cVar2 & 4) == 0) {
      iLit0 = (clause)0x1;
    }
    else {
      iLit0 = c[(ulong)((uint)cVar2 >> 0xb) + 1];
      if ((int)iLit0 < 0) {
        iLit0 = (clause)0x0;
        for (uVar5 = 0; uVar5 < (uint)cVar2 >> 0xb; uVar5 = uVar5 + 1) {
          iVar3 = Abc_Lit2Var((int)c[uVar5 + 1]);
          p_00 = p->vVar2Glo;
          if (iVar3 < p_00->nSize) {
            iVar3 = Abc_Lit2Var((int)c[uVar5 + 1]);
            iVar3 = Vec_IntEntry(p_00,iVar3);
            if (-1 < iVar3) {
              pGVar1 = p->pGia;
              iVar3 = Vec_IntEntry(pGVar1->vCis,iVar3);
              pObj = Gia_ManObj(pGVar1,iVar3);
              iVar3 = Gia_ObjId(pGVar1,pObj);
              pGVar1 = p->pGia;
              iVar4 = Abc_LitIsCompl((int)c[uVar5 + 1]);
              if (iVar3 < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10b,"int Abc_Var2Lit(int, int)");
              }
              iLit0 = (clause)Gia_ManHashOr(pGVar1,(int)iLit0,iVar4 + iVar3 * 2);
            }
          }
          cVar2 = *c;
        }
        c[(ulong)((uint)cVar2 >> 0xb) + 1] = iLit0;
      }
    }
  }
  else {
    iLit0 = *(clause *)((p->pSat->claProofs).ptr + (int)c[(ulong)((uint)cVar2 >> 0xb) + 1]);
  }
  return (int)iLit0;
}

Assistant:

int Int2_ManChainStart( Int2_Man_t * p, clause * c )
{
    if ( c->lrn )
        return veci_begin(&p->pSat->claProofs)[clause_id(c)];
    if ( !c->partA )
        return 1;
    if ( c->lits[c->size] < 0 )
    {
        int i, Var, CiId, Res = 0;
        for ( i = 0; i < (int)c->size; i++ )
        {
            // get ID of the global variable
            if ( Abc_Lit2Var(c->lits[i]) >= Vec_IntSize(p->vVar2Glo) )
                continue;
            Var = Vec_IntEntry( p->vVar2Glo, Abc_Lit2Var(c->lits[i]) );
            if ( Var < 0 )
                continue;
            // get literal of the AIG node
            CiId = Gia_ObjId( p->pGia, Gia_ManCi(p->pGia, Var) );
            // compute interpolant of the clause
            Res = Gia_ManHashOr( p->pGia, Res, Abc_Var2Lit(CiId, Abc_LitIsCompl(c->lits[i])) );
        }
        c->lits[c->size] = Res;
    }
    return c->lits[c->size];
}